

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O0

_Bool is_valid_pf(player *p,loc grid,_Bool only_known,_Bool forbid_traps)

{
  _Bool _Var1;
  _Bool forbid_traps_local;
  _Bool only_known_local;
  player *p_local;
  loc grid_local;
  
  _Var1 = square_isknown((chunk *)p->cave,(loc_conflict)grid);
  if (_Var1) {
    _Var1 = square_isdamaging((chunk *)p->cave,(loc_conflict)grid);
    if (_Var1) {
      grid_local.x._3_1_ = false;
    }
    else if (((!forbid_traps) ||
             (_Var1 = square_isvisibletrap((chunk *)p->cave,(loc_conflict)grid), !_Var1)) ||
            (_Var1 = player_is_trapsafe(p), _Var1)) {
      _Var1 = square_ispassable((chunk *)p->cave,(loc_conflict)grid);
      if (_Var1) {
        grid_local.x._3_1_ = true;
      }
      else {
        _Var1 = square_iscloseddoor((chunk *)p->cave,(loc_conflict)grid);
        if ((_Var1) || (_Var1 = square_isrubble((chunk *)p->cave,(loc_conflict)grid), _Var1)) {
          grid_local.x._3_1_ = true;
        }
        else {
          grid_local.x._3_1_ = false;
        }
      }
    }
    else {
      grid_local.x._3_1_ = false;
    }
  }
  else {
    grid_local.x._3_1_ = (_Bool)((only_known ^ 0xffU) & 1);
  }
  return grid_local.x._3_1_;
}

Assistant:

static bool is_valid_pf(struct player *p, struct loc grid, bool only_known,
		bool forbid_traps)
{
	/*
	 * If only_known is true, do not want to consider unremembered squares;
	 * otherwise, they are acceptable.
	 */
	if (!square_isknown(p->cave, grid)) return !only_known;

	/*
	 * For all remaining tests, use the player's memory of what's there
	 * to avoid leaking information if the terrain has changed.
	 */
	/* No damaging terrain */
	if (square_isdamaging(p->cave, grid)) return false;

	/* No trapped squares if forbidding traps unless trapsafe */
	if (forbid_traps && square_isvisibletrap(p->cave, grid)
			&& !player_is_trapsafe(p)) {
		return false;
	}

	/* All remaining passable terrain is okay. */
	if (square_ispassable(p->cave, grid)) {
		return true;
	}

	/*
	 * Some impassable terrain can be traversed fairly easily by modifying
	 * the terrain so allow those kinds.
	 */
	if (square_iscloseddoor(p->cave, grid)
			|| square_isrubble(p->cave, grid)) {
		return true;
	}

	/* Reject all other impassable terrain. */
	return false;
}